

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O2

quint16 qChecksum(QByteArrayView data,ChecksumType standard)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  ushort uVar4;
  
  lVar2 = 0;
  uVar3 = 0x6363;
  if (standard != ChecksumItuV41) {
    uVar3 = 0;
  }
  uVar1 = (ulong)(-(uint)(standard == ChecksumIso3309) | uVar3);
  for (; data.m_size != lVar2; lVar2 = lVar2 + 1) {
    uVar4 = (ushort)((uVar1 & 0xffff) >> 4) ^
            crc_tbl[((uint)uVar1 ^ (uint)(byte)data.m_data[lVar2]) & 0xf];
    uVar1 = (ulong)(ushort)(uVar4 >> 4 ^
                           crc_tbl[uVar4 & 0xf ^ (uint)((byte)data.m_data[lVar2] >> 4)]);
  }
  return (ushort)uVar1 ^ -(ushort)(standard == ChecksumIso3309);
}

Assistant:

quint16 qChecksum(QByteArrayView data, Qt::ChecksumType standard)
{
    quint16 crc = 0x0000;
    switch (standard) {
    case Qt::ChecksumIso3309:
        crc = 0xffff;
        break;
    case Qt::ChecksumItuV41:
        crc = 0x6363;
        break;
    }
    uchar c;
    const uchar *p = reinterpret_cast<const uchar *>(data.data());
    qsizetype len = data.size();
    while (len--) {
        c = *p++;
        crc = ((crc >> 4) & 0x0fff) ^ crc_tbl[((crc ^ c) & 15)];
        c >>= 4;
        crc = ((crc >> 4) & 0x0fff) ^ crc_tbl[((crc ^ c) & 15)];
    }
    switch (standard) {
    case Qt::ChecksumIso3309:
        crc = ~crc;
        break;
    case Qt::ChecksumItuV41:
        break;
    }
    return crc & 0xffff;
}